

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  char *text;
  ImGuiStyle *pIVar6;
  int column_n;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar7 [64];
  undefined1 local_28 [16];
  undefined1 extraout_var [56];
  
  local_28._0_4_ = GetTextLineHeight();
  local_28._4_4_ = extraout_XMM0_Db;
  local_28._8_4_ = extraout_XMM0_Dc;
  local_28._12_4_ = extraout_XMM0_Dd;
  if ((GImGui->CurrentTable != (ImGuiTable *)0x0) &&
     (iVar2 = GImGui->CurrentTable->ColumnsCount, 0 < iVar2)) {
    column_n = 0;
    do {
      uVar5 = TableGetColumnFlags(column_n);
      if ((uVar5 >> 0x14 & 1) != 0) {
        if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
          text = (char *)0x0;
        }
        else {
          text = TableGetColumnName(GImGui->CurrentTable,column_n);
        }
        auVar7._0_8_ = CalcTextSize(text,(char *)0x0,false,-1.0);
        auVar7._8_56_ = extraout_var;
        auVar4 = vmovshdup_avx(auVar7._0_16_);
        auVar3 = vcmpss_avx(auVar4,local_28,2);
        local_28 = vblendvps_avx(auVar4,local_28,auVar3);
      }
      column_n = column_n + 1;
    } while (iVar2 != column_n);
  }
  pIVar6 = GetStyle();
  fVar1 = (pIVar6->CellPadding).y;
  return fVar1 + fVar1 + (float)local_28._0_4_;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
        if (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_IsEnabled)
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}